

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  element_type *peVar5;
  void *pvVar6;
  char *pcVar7;
  ostream *poVar8;
  _Ios_Openmode in_ESI;
  byte in_R8B;
  byte in_R9B;
  Real RVar9;
  double dVar10;
  byte in_stack_00000008;
  int i_3;
  int nNonzeros_1;
  int i_2;
  VectorRational primal_1;
  int i_1;
  int nNonzeros;
  int i;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  ofstream outfile;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff918;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff920;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff928;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff968;
  undefined2 in_stack_fffffffffffff96c;
  undefined1 in_stack_fffffffffffff96e;
  undefined1 in_stack_fffffffffffff96f;
  ostream *in_stack_fffffffffffff970;
  ostream *in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff9a8;
  byte in_stack_fffffffffffff9af;
  ostream *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  int iVar11;
  undefined4 in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 local_4bc;
  undefined1 local_4b8 [76];
  int local_46c;
  int local_468;
  int local_464;
  int local_460;
  undefined4 local_45c;
  undefined1 local_458 [68];
  int local_414;
  int local_3f4;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  undefined1 local_3bc [80];
  int local_36c;
  int local_368;
  int local_364;
  int local_34c;
  int local_348;
  int local_344;
  undefined1 local_32c [80];
  int local_2dc;
  ostream local_2c0 [548];
  int local_9c;
  int local_98;
  byte local_93;
  byte local_92;
  byte local_91;
  _Ios_Openmode local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 *local_40;
  undefined1 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_91 = in_R8B & 1;
  local_92 = in_R9B & 1;
  local_93 = in_stack_00000008 & 1;
  local_80 = in_ESI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff918);
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x155c42);
  RVar9 = ::soplex::Tolerances::epsilon(peVar5);
  dVar10 = log10(RVar9);
  local_98 = (int)-dVar10;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x155c92);
  local_9c = local_98 + 10;
  std::ofstream::ofstream(local_2c0);
  if ((local_93 & 1) == 0) {
    std::ofstream::open((char *)local_2c0,local_80);
  }
  else {
    std::ofstream::open((char *)local_2c0,local_80);
  }
  if ((local_91 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x155d50);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(in_stack_fffffffffffff930,(int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(in_stack_fffffffffffff928,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff920);
    if (bVar1) {
      std::operator<<(local_2c0,"\nPrimal ray (name, value):\n");
      for (local_2dc = 0; iVar11 = local_2dc,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x155dd9), iVar11 < iVar4; local_2dc = local_2dc + 1) {
        local_20 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff920,
                                (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_18 = local_32c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff918);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x155e63);
        ::soplex::Tolerances::epsilon(peVar5);
        bVar1 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           (double)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x155ea2)
        ;
        if (bVar1) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff920,
                              (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          poVar8 = std::operator<<(local_2c0,pcVar7);
          poVar8 = std::operator<<(poVar8,"\t");
          local_344 = (int)std::setw(local_9c);
          poVar8 = std::operator<<(poVar8,(_Setw)local_344);
          local_348 = (int)std::setprecision(local_98);
          std::operator<<(poVar8,(_Setprecision)local_348);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
          ;
          poVar8 = boost::multiprecision::operator<<
                             (in_stack_fffffffffffff9b0,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        }
      }
      poVar8 = std::operator<<(local_2c0,"All other entries are zero (within ");
      local_34c = (int)std::setprecision(1);
      poVar8 = std::operator<<(poVar8,(_Setprecision)local_34c);
      pvVar6 = (void *)std::ostream::operator<<(poVar8,std::scientific);
      ::soplex::
      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances(in_stack_fffffffffffff918);
      peVar5 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1560a1);
      RVar9 = ::soplex::Tolerances::epsilon(peVar5);
      poVar8 = (ostream *)std::ostream::operator<<(pvVar6,RVar9);
      local_364 = (int)std::setprecision(8);
      poVar8 = std::operator<<(poVar8,(_Setprecision)local_364);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
      poVar8 = std::operator<<(poVar8,").");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x156162);
    }
    else {
      bVar1 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isPrimalFeasible(in_stack_fffffffffffff920);
      if ((bVar1) &&
         (bVar1 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getPrimal(in_stack_fffffffffffff928,
                              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff920), bVar1)) {
        local_368 = 0;
        std::operator<<(local_2c0,"\nPrimal solution (name, value):\n");
        for (local_36c = 0; iVar11 = local_36c,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x156228), iVar11 < iVar4; local_36c = local_36c + 1) {
          local_10 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff920,
                                  (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          local_8 = local_3bc;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff918);
          peVar5 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1562b2);
          ::soplex::Tolerances::epsilon(peVar5);
          bVar1 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                             (double)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x1562f1);
          if (bVar1) {
            pcVar7 = ::soplex::NameSet::operator[]
                               ((NameSet *)in_stack_fffffffffffff920,
                                (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
            poVar8 = std::operator<<(local_2c0,pcVar7);
            poVar8 = std::operator<<(poVar8,"\t");
            local_3d4 = (int)std::setw(local_9c);
            poVar8 = std::operator<<(poVar8,(_Setw)local_3d4);
            local_3d8 = (int)std::setprecision(local_98);
            std::operator<<(poVar8,(_Setprecision)local_3d8);
            ::soplex::
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff920,
                         (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
            poVar8 = boost::multiprecision::operator<<
                               (in_stack_fffffffffffff9b0,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            local_368 = local_368 + 1;
          }
        }
        poVar8 = std::operator<<(local_2c0,"All other variables are zero (within ");
        local_3dc = (int)std::setprecision(1);
        poVar8 = std::operator<<(poVar8,(_Setprecision)local_3dc);
        pvVar6 = (void *)std::ostream::operator<<(poVar8,std::scientific);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff918);
        peVar5 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1564e8);
        RVar9 = ::soplex::Tolerances::epsilon(peVar5);
        poVar8 = (ostream *)std::ostream::operator<<(pvVar6,RVar9);
        local_3f4 = (int)std::setprecision(8);
        poVar8 = std::operator<<(poVar8,(_Setprecision)local_3f4);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
        poVar8 = std::operator<<(poVar8,"). Solution has ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_368);
        poVar8 = std::operator<<(poVar8," nonzero entries.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1565e5)
        ;
      }
      else {
        std::operator<<(local_2c0,"No primal information available.\n");
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x156631);
  }
  if ((local_92 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x156660);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff930,(int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (in_stack_fffffffffffff928,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff920);
    if (bVar1) {
      std::operator<<(local_2c0,"\nPrimal ray (name, value):\n");
      local_414 = 0;
      while (iVar11 = local_414,
            iVar4 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x1566e9), iVar11 < iVar4) {
        in_stack_fffffffffffff9b0 =
             (ostream *)
             ::soplex::
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff920,
                          (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_45c = 0;
        local_58 = local_458;
        local_60 = &local_45c;
        local_68 = 0;
        local_70 = 0;
        local_28 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff978,(longlong *)in_stack_fffffffffffff970,
                   (type *)CONCAT17(in_stack_fffffffffffff96f,
                                    CONCAT16(in_stack_fffffffffffff96e,
                                             CONCAT24(in_stack_fffffffffffff96c,
                                                      in_stack_fffffffffffff968))));
        in_stack_fffffffffffff9af =
             boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffff918,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1567b0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1567c6);
        if ((in_stack_fffffffffffff9af & 1) != 0) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff920,
                              (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          poVar8 = std::operator<<(local_2c0,pcVar7);
          poVar8 = std::operator<<(poVar8,"\t");
          local_460 = (int)std::setw(local_9c);
          poVar8 = std::operator<<(poVar8,(_Setw)local_460);
          local_464 = (int)std::setprecision(local_98);
          std::operator<<(poVar8,(_Setprecision)local_464);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
          ;
          in_stack_fffffffffffff978 =
               boost::multiprecision::operator<<
                         (in_stack_fffffffffffff9b0,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          std::ostream::operator<<(in_stack_fffffffffffff978,std::endl<char,std::char_traits<char>>)
          ;
        }
        local_414 = local_414 + 1;
      }
      in_stack_fffffffffffff970 = std::operator<<(local_2c0,"All other entries are zero.");
      std::ostream::operator<<(in_stack_fffffffffffff970,std::endl<char,std::char_traits<char>>);
    }
    uVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(in_stack_fffffffffffff920);
    if (((bool)uVar2) &&
       (uVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(in_stack_fffffffffffff928,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff920), (bool)uVar3)) {
      local_468 = 0;
      std::operator<<(local_2c0,"\nPrimal solution (name, value):\n");
      for (local_46c = 0; iVar11 = local_46c,
          iVar4 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x1569d4), iVar11 < iVar4; local_46c = local_46c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_4bc = 0;
        local_38 = local_4b8;
        local_40 = &local_4bc;
        local_48 = 0;
        local_50 = 0;
        local_30 = local_40;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff978,(longlong *)in_stack_fffffffffffff970,
                   (type *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffff96c,iVar4)))
                  );
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff918,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x156a8c);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x156a9f);
        if (bVar1) {
          pcVar7 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff920,
                              (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          poVar8 = std::operator<<(local_2c0,pcVar7);
          std::operator<<(poVar8,"\t");
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20))
          ;
          poVar8 = boost::multiprecision::operator<<
                             (in_stack_fffffffffffff9b0,
                              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          local_468 = local_468 + 1;
        }
      }
      poVar8 = std::operator<<(local_2c0,"All other variables are zero. Solution has ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_468);
      poVar8 = std::operator<<(poVar8," nonzero entries.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator<<(local_2c0,"No primal (rational) solution available.\n");
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x156c07);
  }
  std::ofstream::~ofstream(local_2c0);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}